

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVTools.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Diligent::OptimizeSPIRV
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV,spv_target_env TargetEnv,
          SPIRV_OPTIMIZATION_FLAGS Passes)

{
  bool bVar1;
  SPIRV_OPTIMIZATION_FLAGS SVar2;
  Char *Message;
  uint *original_binary;
  size_type original_binary_size;
  spv_optimizer_options opt_options;
  undefined4 in_register_0000000c;
  PassToken local_90;
  ValidatorOptions local_88;
  ValidatorOptions ValidatorOptions;
  OptimizerOptions Options;
  Optimizer local_58;
  Optimizer SpirvOptimizer;
  undefined1 local_40 [8];
  string msg;
  SPIRV_OPTIMIZATION_FLAGS Passes_local;
  spv_target_env TargetEnv_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *SrcSPIRV_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *OptimizedSPIRV;
  
  msg.field_2._8_4_ = Passes;
  msg.field_2._12_4_ = TargetEnv;
  if (Passes == SPIRV_OPTIMIZATION_FLAG_NONE) {
    FormatString<char[26],char[39]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Passes != SPIRV_OPTIMIZATION_FLAG_NONE",
               (char (*) [39])CONCAT44(in_register_0000000c,Passes));
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"OptimizeSPIRV",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVTools.cpp"
               ,0x70);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (msg.field_2._12_4_ == 0x1b) {
    msg.field_2._12_4_ = anon_unknown_5::SpvTargetEnvFromSPIRV(SrcSPIRV);
  }
  spvtools::Optimizer::Optimizer(&local_58,msg.field_2._12_4_);
  std::function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)>::
  function<void(&)(spv_message_level_t,char_const*,spv_position_t_const&,char_const*),void>
            ((function<void(spv_message_level_t,char_const*,spv_position_t_const&,char_const*)> *)
             &Options,anon_unknown_5::SpvOptimizerMessageConsumer);
  spvtools::Optimizer::SetMessageConsumer(&local_58,(MessageConsumer *)&Options);
  std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
  ~function((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
             *)&Options);
  spvtools::OptimizerOptions::OptimizerOptions((OptimizerOptions *)&ValidatorOptions);
  SVar2 = operator&(msg.field_2._8_4_,SPIRV_OPTIMIZATION_FLAG_LEGALIZATION);
  if (SVar2 != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::Optimizer::RegisterLegalizationPasses(&local_58);
    spvtools::ValidatorOptions::ValidatorOptions(&local_88);
    spvtools::ValidatorOptions::SetBeforeHlslLegalization(&local_88,true);
    spvtools::OptimizerOptions::set_validator_options
              ((OptimizerOptions *)&ValidatorOptions,&local_88);
    spvtools::ValidatorOptions::~ValidatorOptions(&local_88);
  }
  SVar2 = operator&(msg.field_2._8_4_,SPIRV_OPTIMIZATION_FLAG_PERFORMANCE);
  if (SVar2 != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::Optimizer::RegisterPerformancePasses(&local_58);
  }
  SVar2 = operator&(msg.field_2._8_4_,SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION);
  if (SVar2 != SPIRV_OPTIMIZATION_FLAG_NONE) {
    spvtools::CreateStripReflectInfoPass();
    spvtools::Optimizer::RegisterPass(&local_58,&local_90);
    spvtools::Optimizer::PassToken::~PassToken(&local_90);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(__return_storage_ptr__);
  original_binary = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(SrcSPIRV);
  original_binary_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(SrcSPIRV);
  opt_options = spvtools::OptimizerOptions::operator_cast_to_spv_optimizer_options_t_
                          ((OptimizerOptions *)&ValidatorOptions);
  bVar1 = spvtools::Optimizer::Run
                    (&local_58,original_binary,original_binary_size,__return_storage_ptr__,
                     opt_options);
  if (!bVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(__return_storage_ptr__);
  }
  spvtools::OptimizerOptions::~OptimizerOptions((OptimizerOptions *)&ValidatorOptions);
  spvtools::Optimizer::~Optimizer(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint32_t> OptimizeSPIRV(const std::vector<uint32_t>& SrcSPIRV, spv_target_env TargetEnv, SPIRV_OPTIMIZATION_FLAGS Passes)
{
    VERIFY_EXPR(Passes != SPIRV_OPTIMIZATION_FLAG_NONE);

    if (TargetEnv == SPV_ENV_MAX)
        TargetEnv = SpvTargetEnvFromSPIRV(SrcSPIRV);

    spvtools::Optimizer SpirvOptimizer(TargetEnv);
    SpirvOptimizer.SetMessageConsumer(SpvOptimizerMessageConsumer);

    spvtools::OptimizerOptions Options;
#ifndef DILIGENT_DEVELOPMENT
    // Do not run validator in release build
    Options.set_run_validator(false);
#endif

    // SPIR-V bytecode generated from HLSL must be legalized to
    // turn it into a valid vulkan SPIR-V shader.
    if (Passes & SPIRV_OPTIMIZATION_FLAG_LEGALIZATION)
    {
        SpirvOptimizer.RegisterLegalizationPasses();

        spvtools::ValidatorOptions ValidatorOptions;
        ValidatorOptions.SetBeforeHlslLegalization(true);
        Options.set_validator_options(ValidatorOptions);
    }

    if (Passes & SPIRV_OPTIMIZATION_FLAG_PERFORMANCE)
    {
        SpirvOptimizer.RegisterPerformancePasses();
    }

    if (Passes & SPIRV_OPTIMIZATION_FLAG_STRIP_REFLECTION)
    {
        // Decorations defined in SPV_GOOGLE_hlsl_functionality1 are the only instructions
        // removed by strip-reflect-info pass. SPIRV offsets become INVALID after this operation.
        SpirvOptimizer.RegisterPass(spvtools::CreateStripReflectInfoPass());
    }

    std::vector<uint32_t> OptimizedSPIRV;
    if (!SpirvOptimizer.Run(SrcSPIRV.data(), SrcSPIRV.size(), &OptimizedSPIRV, Options))
        OptimizedSPIRV.clear();

    return OptimizedSPIRV;
}